

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3ExprCode(Parse *pParse,Expr *pExpr,int target)

{
  int p1;
  int op;
  Vdbe *p;
  
  if ((pExpr == (Expr *)0x0) || (pExpr->op != 0x84)) {
    p1 = sqlite3ExprCodeTarget(pParse,pExpr,target);
    if (p1 == target) {
      return target;
    }
    p = pParse->pVdbe;
    if (p == (Vdbe *)0x0) {
      return target;
    }
    op = 0xf;
  }
  else {
    p = pParse->pVdbe;
    p1 = pExpr->iTable;
    op = 0xe;
  }
  sqlite3VdbeAddOp2(p,op,p1,target);
  return target;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCode(Parse *pParse, Expr *pExpr, int target){
  int inReg;

  assert( target>0 && target<=pParse->nMem );
  if( pExpr && pExpr->op==TK_REGISTER ){
    sqlite3VdbeAddOp2(pParse->pVdbe, OP_Copy, pExpr->iTable, target);
  }else{
    inReg = sqlite3ExprCodeTarget(pParse, pExpr, target);
    assert( pParse->pVdbe || pParse->db->mallocFailed );
    if( inReg!=target && pParse->pVdbe ){
      sqlite3VdbeAddOp2(pParse->pVdbe, OP_SCopy, inReg, target);
    }
  }
  return target;
}